

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O2

void JsrtDebugUtils::AddScriptIdToObject(DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  Utf8SourceInfo *pUVar1;
  
  AddPropertyToObject(object,(JsrtDebugPropertyId)0x1a,utf8SourceInfo->m_sourceInfoId,
                      (utf8SourceInfo->m_scriptContext).ptr);
  pUVar1 = Js::Utf8SourceInfo::GetCallerUtf8SourceInfo(utf8SourceInfo);
  if (pUVar1 != (Utf8SourceInfo *)0x0) {
    AddPropertyToObject(object,(JsrtDebugPropertyId)0x14,pUVar1->m_sourceInfoId,
                        (pUVar1->m_scriptContext).ptr);
    return;
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddScriptIdToObject(Js::DynamicObject* object, Js::Utf8SourceInfo* utf8SourceInfo)
{
    JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::scriptId, utf8SourceInfo->GetSourceInfoId(), utf8SourceInfo->GetScriptContext());

    Js::Utf8SourceInfo* callerUtf8SourceInfo = utf8SourceInfo->GetCallerUtf8SourceInfo();
    if (callerUtf8SourceInfo != nullptr)
    {
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::parentScriptId, callerUtf8SourceInfo->GetSourceInfoId(), callerUtf8SourceInfo->GetScriptContext());
    }
}